

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O3

void cmFortranParser_RuleInclude(cmFortranParser *parser,char *name)

{
  pointer pcVar1;
  bool bVar2;
  _Elt_pointer pcVar3;
  string fullName;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48 [2];
  long local_38 [2];
  
  if (parser->InPPFalseBranch == 0) {
    pcVar3 = (parser->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pcVar3 == (parser->FileStack).c.
                  super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) {
      __assert_fail("!parser->FileStack.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmFortranParserImpl.cxx"
                    ,0xf8,"void cmFortranParser_RuleInclude(cmFortranParser *, const char *)");
    }
    if (pcVar3 == (parser->FileStack).c.
                  super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pcVar3 = (parser->FileStack).c.
               super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 10;
    }
    pcVar1 = pcVar3[-1].Directory._M_dataplus._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + pcVar3[-1].Directory._M_string_length);
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    bVar2 = cmFortranParser_s::FindIncludeFile(parser,(char *)local_48[0],name,&local_68);
    if (bVar2) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&parser->Info->Includes,&local_68);
      cmFortranParser_FilePush(parser,local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return;
}

Assistant:

void cmFortranParser_RuleInclude(cmFortranParser* parser,
                                        const char* name)
{
  if(parser->InPPFalseBranch)
    {
    return;
    }

  // If processing an include statement there must be an open file.
  assert(!parser->FileStack.empty());

  // Get the directory containing the source in which the include
  // statement appears.  This is always the first search location for
  // Fortran include files.
  std::string dir = parser->FileStack.top().Directory;

  // Find the included file.  If it cannot be found just ignore the
  // problem because either the source will not compile or the user
  // does not care about depending on this included source.
  std::string fullName;
  if(parser->FindIncludeFile(dir.c_str(), name, fullName))
    {
    // Found the included file.  Save it in the set of included files.
    parser->Info.Includes.insert(fullName);

    // Parse it immediately to translate the source inline.
    cmFortranParser_FilePush(parser, fullName.c_str());
    }
}